

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O0

void __thiscall EvalString::AddSpecial(EvalString *this,StringPiece text)

{
  TokenType local_6c;
  string local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>
  local_48;
  EvalString *local_20;
  EvalString *this_local;
  StringPiece text_local;
  
  text_local.str_ = (char *)text.len_;
  this_local = (EvalString *)text.str_;
  local_20 = this;
  StringPiece::AsString_abi_cxx11_(&local_68,(StringPiece *)&this_local);
  local_6c = SPECIAL;
  std::make_pair<std::__cxx11::string,EvalString::TokenType>(&local_48,&local_68,&local_6c);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::push_back(&this->parsed_,&local_48);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>
  ::~pair(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void EvalString::AddSpecial(StringPiece text) {
  parsed_.push_back(make_pair(text.AsString(), SPECIAL));
}